

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.hpp
# Opt level: O2

void __thiscall ESF_Data_Base<ESF>::ESF_Data_Base(ESF_Data_Base<ESF> *this)

{
  this->id = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->shout)._M_dataplus._M_p = (pointer)&(this->shout).field_2;
  (this->shout)._M_string_length = 0;
  (this->shout).field_2._M_local_buf[0] = '\0';
  this->icon = 0;
  this->graphic = 0;
  this->tp = 0;
  this->sp = 0;
  this->cast_time = '\0';
  this->type = Damage;
  this->target_restrict = NPCOnly;
  this->target = Normal;
  this->mindam = 0;
  this->maxdam = 0;
  this->accuracy = 0;
  this->hp = 0;
  return;
}

Assistant:

ESF_Data_Base() : id(0), icon(0), graphic(0), tp(0), sp(0), cast_time(0), type(ESF::Damage),
	target_restrict(ESF::NPCOnly), target(ESF::Normal), mindam(0), maxdam(0), accuracy(0), hp(0) { }